

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

Edge * __thiscall
anon_unknown.dwarf_f8f5b::VertexIdEdgeVectorShape::edge
          (Edge *__return_storage_ptr__,VertexIdEdgeVectorShape *this,int e)

{
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *pvVar1;
  const_reference pvVar2;
  const_reference _v0;
  const_reference _v1;
  int e_local;
  VertexIdEdgeVectorShape *this_local;
  
  pvVar1 = this->vertices_;
  pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (this->edges_,(long)e);
  _v0 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (pvVar1,(long)pvVar2->first);
  pvVar1 = this->vertices_;
  pvVar2 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     (this->edges_,(long)e);
  _v1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (pvVar1,(long)pvVar2->second);
  S2Shape::Edge::Edge(__return_storage_ptr__,_v0,_v1);
  return __return_storage_ptr__;
}

Assistant:

Edge edge(int e) const override {
    return Edge(vertices_[edges_[e].first], vertices_[edges_[e].second]);
  }